

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeWriter.cpp
# Opt level: O0

uint32 __thiscall
Js::WasmByteCodeWriter::WasmLoopStart
          (WasmByteCodeWriter *this,ByteCodeLabel loopEntrance,RegSlot *curRegs)

{
  List<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  undefined1 local_30 [7];
  bool success;
  uint local_24;
  RegSlot *pRStack_20;
  uint loopId;
  RegSlot *curRegs_local;
  WasmByteCodeWriter *pWStack_10;
  ByteCodeLabel loopEntrance_local;
  WasmByteCodeWriter *this_local;
  
  pRStack_20 = curRegs;
  curRegs_local._4_4_ = loopEntrance;
  pWStack_10 = this;
  local_24 = FunctionBody::IncrLoopCount((this->super_ByteCodeWriter).m_functionWrite);
  uVar3 = JsUtil::
          ReadOnlyList<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_DefaultComparer>
          ::Count(&((this->super_ByteCodeWriter).m_loopHeaders)->
                   super_ReadOnlyList<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_DefaultComparer>
                 );
  if (uVar3 != local_24) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/WasmByteCodeWriter.cpp"
                                ,0x2f,"((uint)m_loopHeaders->Count() == loopId)",
                                "(uint)m_loopHeaders->Count() == loopId");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this_00 = (this->super_ByteCodeWriter).m_loopHeaders;
  uVar3 = ByteCodeWriter::Data::GetCurrentOffset(&(this->super_ByteCodeWriter).m_byteCodeData);
  ByteCodeWriter::LoopHeaderData::LoopHeaderData
            ((LoopHeaderData *)local_30,uVar3,0,0 < (this->super_ByteCodeWriter).m_loopNest,false);
  JsUtil::
  List<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::Add(this_00,(LoopHeaderData *)local_30);
  (this->super_ByteCodeWriter).m_loopNest = (this->super_ByteCodeWriter).m_loopNest + 1;
  (*(this->super_IWasmByteCodeWriter)._vptr_IWasmByteCodeWriter[6])(this,(ulong)curRegs_local._4_4_)
  ;
  bVar2 = TryWriteWasmLoopStart<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,WasmLoopBodyStart,local_24,pRStack_20);
  if (((!bVar2) &&
      (bVar2 = TryWriteWasmLoopStart<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                         (this,WasmLoopBodyStart,local_24,pRStack_20), !bVar2)) &&
     (bVar2 = TryWriteWasmLoopStart<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        (this,WasmLoopBodyStart,local_24,pRStack_20), !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/WasmByteCodeWriter.cpp"
                                ,0x34,"(success)","success");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  return local_24;
}

Assistant:

uint32 WasmByteCodeWriter::WasmLoopStart(ByteCodeLabel loopEntrance, __in_ecount(WAsmJs::LIMIT) RegSlot* curRegs)
{
    uint loopId = m_functionWrite->IncrLoopCount();
    Assert((uint)m_loopHeaders->Count() == loopId);

    m_loopHeaders->Add(LoopHeaderData(m_byteCodeData.GetCurrentOffset(), 0, m_loopNest > 0, false));
    m_loopNest++;
    this->MarkAsmJsLabel(loopEntrance);
    MULTISIZE_LAYOUT_WRITE(WasmLoopStart, Js::OpCodeAsmJs::WasmLoopBodyStart, loopId, curRegs);

    return loopId;
}